

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::IntCastToVarInt>>
               (uchar *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  idx_t iVar6;
  undefined8 uVar7;
  char *extraout_RDX;
  char *pcVar8;
  char *extraout_RDX_00;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char **ppcVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  string_t sVar17;
  Vector *result;
  char **local_78;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = &(result_data->value).pointer.ptr;
      iVar9 = 0;
      pcVar8 = (char *)count;
      do {
        sVar17 = IntToVarInt<unsigned_char>
                           ((duckdb *)dataptr,(Vector *)(ulong)ldata[iVar9],(uchar)pcVar8);
        pcVar8 = sVar17.value._8_8_;
        iVar6 = sVar17.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_78 + -1);
        paVar1->length = (int)iVar6;
        paVar1->prefix[0] = (char)(iVar6 >> 0x20);
        paVar1->prefix[1] = (char)(iVar6 >> 0x28);
        paVar1->prefix[2] = (char)(iVar6 >> 0x30);
        paVar1->prefix[3] = (char)(iVar6 >> 0x38);
        *local_78 = pcVar8;
        iVar9 = iVar9 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar9);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var4 = p_Stack_40;
      peVar3 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar5->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      pcVar8 = extraout_RDX;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
      pcVar8 = extraout_RDX_00;
    }
    if (0x3f < count + 0x3f) {
      uVar11 = 0;
      uVar15 = 0;
      do {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar16 = 0xffffffffffffffff;
        }
        else {
          uVar16 = puVar2[uVar11];
        }
        uVar10 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar10 = count;
        }
        uVar14 = uVar10;
        if (uVar16 != 0) {
          uVar14 = uVar15;
          if (uVar16 == 0xffffffffffffffff) {
            if (uVar15 < uVar10) {
              ppcVar13 = &result_data[uVar15].value.pointer.ptr;
              do {
                sVar17 = IntToVarInt<unsigned_char>
                                   ((duckdb *)dataptr,(Vector *)(ulong)ldata[uVar14],(uchar)pcVar8);
                pcVar8 = sVar17.value._8_8_;
                uVar7 = sVar17.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
                paVar1->length = (int)uVar7;
                paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
                *ppcVar13 = pcVar8;
                uVar14 = uVar14 + 1;
                ppcVar13 = ppcVar13 + 2;
              } while (uVar10 != uVar14);
            }
          }
          else if (uVar15 < uVar10) {
            ppcVar13 = &result_data[uVar15].value.pointer.ptr;
            uVar12 = 0;
            do {
              if ((uVar16 >> (uVar12 & 0x3f) & 1) != 0) {
                sVar17 = IntToVarInt<unsigned_char>
                                   ((duckdb *)dataptr,(Vector *)(ulong)ldata[uVar15],(uchar)pcVar8);
                pcVar8 = sVar17.value._8_8_;
                uVar7 = sVar17.value._0_8_;
                paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar13 + -1);
                paVar1->length = (int)uVar7;
                paVar1->prefix[0] = (char)((ulong)uVar7 >> 0x20);
                paVar1->prefix[1] = (char)((ulong)uVar7 >> 0x28);
                paVar1->prefix[2] = (char)((ulong)uVar7 >> 0x30);
                paVar1->prefix[3] = (char)((ulong)uVar7 >> 0x38);
                *ppcVar13 = pcVar8;
              }
              uVar15 = uVar15 + 1;
              ppcVar13 = ppcVar13 + 2;
              uVar12 = uVar12 + 1;
              uVar14 = uVar15;
            } while (uVar10 != uVar15);
          }
        }
        uVar11 = uVar11 + 1;
        uVar15 = uVar14;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}